

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_auth_digest_resp_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  if (pop3code == 0x2b) {
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"");
    if (data._4_4_ == CURLE_OK) {
      state(conn,POP3_AUTH);
    }
  }
  else {
    Curl_failf(conn->data,"Authentication failed: %d",(ulong)(uint)pop3code);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_auth_digest_resp_resp(struct connectdata *conn,
                                                 int pop3code,
                                                 pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Authentication failed: %d", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else {
    /* Send an empty response */
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "");

    if(!result)
      state(conn, POP3_AUTH);
  }

  return result;
}